

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O1

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig>::SetRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig> *this,TPZAutoPointer<TPZRefPattern> *refpat)

{
  TPZReference *pTVar1;
  int iVar2;
  uint uVar3;
  
  pTVar1 = (this->fRefPattern).fRef;
  if (((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0)) &&
     (iVar2 = TPZRefPattern::operator==(pTVar1->fPointer,refpat->fRef->fPointer), iVar2 != 0)) {
    return;
  }
  iVar2 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTrig>).
                                 super_TPZGeoEl + 0x1d0))(this);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n"
               ,0x55);
    return;
  }
  TPZAutoPointer<TPZRefPattern>::operator=(&this->fRefPattern,refpat);
  pTVar1 = refpat->fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0)) {
    uVar3 = TPZRefPattern::NSubElements(pTVar1->fPointer);
    TPZVec<long>::Resize(&this->fSubEl,(long)(int)uVar3);
    if ((int)uVar3 < 1) {
      return;
    }
    memset((this->fSubEl).fStore,0xff,(ulong)uVar3 << 3);
    return;
  }
  TPZVec<long>::Resize(&this->fSubEl,0);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::SetRefPattern (TPZAutoPointer<TPZRefPattern> refpat){
	
#ifdef HUGE_DEBUG
	if (!refpat) {
		PZError << "Error trying to set a null refinement pattern objetct" << std::endl;
		return;
	}
#endif
	
	if(fRefPattern && (*fRefPattern == *refpat)){//they are the same refinement pattern
		return;
	}
	else if(this->HasSubElement())
	{
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
		LOGPZ_ERROR ( loggerrefpattern, "\nTrying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n" );
#endif
		std::cout << "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n";
		
		return;
	}
	fRefPattern = refpat;
    if(!refpat)
    {
        fSubEl.Resize(0);
    }
    else
    {
        int nsubel = refpat->NSubElements();
        fSubEl.Resize(nsubel);
        for(int i=0;i<nsubel;i++) fSubEl[i] = -1;
    }
}